

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void computeYMD(DateTime *p)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  sqlite3_int64 *in_RDI;
  int X1;
  int E;
  int D;
  int C;
  int B;
  int A;
  int alpha;
  int Z;
  int local_34;
  int local_30;
  
  if (*(char *)((long)in_RDI + 0x29) == '\0') {
    if ((char)in_RDI[5] == '\0') {
      *(undefined4 *)(in_RDI + 1) = 2000;
      *(undefined4 *)((long)in_RDI + 0xc) = 1;
      *(undefined4 *)(in_RDI + 2) = 1;
    }
    else {
      iVar1 = validJulianDay(*in_RDI);
      if (iVar1 == 0) {
        datetimeError((DateTime *)0x22f259);
        return;
      }
      iVar1 = (int)((*in_RDI + 43200000) / 86400000);
      iVar2 = (int)(((double)iVar1 + 32044.75) / 36524.25);
      iVar1 = ((iVar1 + iVar2) - (iVar2 + 0x30) / 4) + 0x5da;
      uVar3 = (uint)(((double)iVar1 - 122.1) / 365.25);
      uVar4 = ((uVar3 & 0x7fff) * 0x8ead) / 100;
      local_30 = (int)((double)(int)(iVar1 - uVar4) / 30.6001);
      *(uint *)(in_RDI + 2) = (iVar1 - uVar4) - (int)((double)local_30 * 30.6001);
      if (local_30 < 0xe) {
        local_30 = local_30 + -1;
      }
      else {
        local_30 = local_30 + -0xd;
      }
      *(int *)((long)in_RDI + 0xc) = local_30;
      if (*(int *)((long)in_RDI + 0xc) < 3) {
        local_34 = uVar3 - 0x126b;
      }
      else {
        local_34 = uVar3 - 0x126c;
      }
      *(int *)(in_RDI + 1) = local_34;
    }
    *(undefined1 *)((long)in_RDI + 0x29) = 1;
  }
  return;
}

Assistant:

static void computeYMD(DateTime *p){
  int Z, alpha, A, B, C, D, E, X1;
  if( p->validYMD ) return;
  if( !p->validJD ){
    p->Y = 2000;
    p->M = 1;
    p->D = 1;
  }else if( !validJulianDay(p->iJD) ){
    datetimeError(p);
    return;
  }else{
    Z = (int)((p->iJD + 43200000)/86400000);
    alpha = (int)((Z + 32044.75)/36524.25) - 52;
    A = Z + 1 + alpha - ((alpha+100)/4) + 25;
    B = A + 1524;
    C = (int)((B - 122.1)/365.25);
    D = (36525*(C&32767))/100;
    E = (int)((B-D)/30.6001);
    X1 = (int)(30.6001*E);
    p->D = B - D - X1;
    p->M = E<14 ? E-1 : E-13;
    p->Y = p->M>2 ? C - 4716 : C - 4715;
  }
  p->validYMD = 1;
}